

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

void __thiscall
tvm::runtime::
TypedPackedFunc<tvm::runtime::Module(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
AssignTypedLambda<tvm::runtime::Module(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>
          (TypedPackedFunc<tvm::runtime::Module(std::__cxx11::string_const&,std::__cxx11::string_const&)>
           *this,_func_Module_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                 *flambda)

{
  anon_class_8_1_54eb228d local_60;
  FType local_58;
  PackedFunc local_38;
  _func_Module_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_18;
  _func_Module_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *flambda_local;
  TypedPackedFunc<tvm::runtime::Module_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  local_60.flambda = flambda;
  local_18 = flambda;
  flambda_local =
       (_func_Module_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
        *)this;
  std::function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)>::
  function<tvm::runtime::TypedPackedFunc<tvm::runtime::Module(std::__cxx11::string_const&,std::__cxx11::string_const&)>::AssignTypedLambda<tvm::runtime::Module(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>(tvm::runtime::Module(*)(std::__cxx11::string_const&,std::__cxx11::string_const&))::_lambda(tvm::runtime::TVMArgs_const&,tvm::runtime::TVMRetValue*)_1_,void>
            ((function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)> *)&local_58,&local_60
            );
  PackedFunc::PackedFunc(&local_38,&local_58);
  PackedFunc::operator=((PackedFunc *)this,&local_38);
  PackedFunc::~PackedFunc(&local_38);
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::~function(&local_58);
  return;
}

Assistant:

inline void TypedPackedFunc<R(Args...)>::AssignTypedLambda(FType flambda) {
  packed_ = PackedFunc([flambda](const TVMArgs& args, TVMRetValue* rv) {
      detail::unpack_call<R, sizeof...(Args)>(flambda, args, rv);
    });
}